

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UserDefinedNetDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UserDefinedNetDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::TimingControlSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,TimingControlSyntax *args_2,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3,Token *args_4)

{
  Token netType;
  UserDefinedNetDeclarationSyntax *pUVar1;
  TimingControlSyntax *in_RCX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDX;
  UserDefinedNetDeclarationSyntax *in_RSI;
  undefined8 in_RDI;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_R8;
  Info *unaff_retaddr;
  Token in_stack_00000010;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pUVar1 = (UserDefinedNetDeclarationSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  netType.info = unaff_retaddr;
  netType.kind = (short)in_RDI;
  netType._2_1_ = (char)((ulong)in_RDI >> 0x10);
  netType.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  netType.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::UserDefinedNetDeclarationSyntax::UserDefinedNetDeclarationSyntax
            (in_RSI,in_RDX,netType,in_RCX,in_R8,in_stack_00000010);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }